

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O1

void testing::internal::JsonUnitTestResultPrinter::PrintJsonTestList
               (ostream *stream,
               vector<testing::TestCase_*,_std::allocator<testing::TestCase_*>_> *test_cases)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer ppTVar2;
  TestCase *pTVar3;
  ostream *poVar4;
  long lVar5;
  long lVar6;
  int value;
  ulong uVar7;
  string kIndent;
  string kTestsuites;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"testsuites","");
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  std::__cxx11::string::_M_construct((ulong)&local_b0,'\x02');
  std::__ostream_insert<char,std::char_traits<char>>(stream,"{\n",2);
  ppTVar2 = (test_cases->
            super__Vector_base<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>)._M_impl.
            super__Vector_impl_data._M_start;
  lVar5 = (long)(test_cases->
                super__Vector_base<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>).
                _M_impl.super__Vector_impl_data._M_finish - (long)ppTVar2;
  if (lVar5 == 0) {
    value = 0;
  }
  else {
    lVar5 = lVar5 >> 3;
    lVar6 = 0;
    value = 0;
    do {
      pTVar3 = ppTVar2[lVar6];
      value = value + (int)((ulong)((long)*(pointer *)
                                           ((long)&(pTVar3->test_info_list_).
                                                                                                      
                                                  super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>
                                                  ._M_impl + 8) -
                                   *(long *)&(pTVar3->test_info_list_).
                                             super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>
                                             ._M_impl.super__Vector_impl_data) >> 3);
      lVar6 = lVar6 + 1;
    } while (lVar5 + (ulong)(lVar5 == 0) != lVar6);
  }
  paVar1 = &local_90.field_2;
  local_90._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"tests","");
  OutputJsonKey(stream,&local_70,&local_90,value,&local_b0,true);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar1) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  local_90._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"name","");
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"AllTests","");
  OutputJsonKey(stream,&local_70,&local_90,&local_50,&local_b0,true);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar1) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (stream,local_b0._M_dataplus._M_p,local_b0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\"",1);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar4,local_70._M_dataplus._M_p,local_70._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\": [\n",5);
  if ((test_cases->super__Vector_base<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>).
      _M_impl.super__Vector_impl_data._M_finish !=
      (test_cases->super__Vector_base<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>).
      _M_impl.super__Vector_impl_data._M_start) {
    uVar7 = 0;
    do {
      if (uVar7 != 0) {
        std::__ostream_insert<char,std::char_traits<char>>(stream,",\n",2);
      }
      PrintJsonTestCase(stream,(test_cases->
                               super__Vector_base<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>
                               )._M_impl.super__Vector_impl_data._M_start[uVar7]);
      uVar7 = uVar7 + 1;
    } while (uVar7 < (ulong)((long)(test_cases->
                                   super__Vector_base<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>
                                   )._M_impl.super__Vector_impl_data._M_finish -
                             (long)(test_cases->
                                   super__Vector_base<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>
                                   )._M_impl.super__Vector_impl_data._M_start >> 3));
  }
  std::__ostream_insert<char,std::char_traits<char>>(stream,"\n",1);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (stream,local_b0._M_dataplus._M_p,local_b0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"]\n",2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"}\n",2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  return;
}

Assistant:

void JsonUnitTestResultPrinter::PrintJsonTestList(
    std::ostream* stream, const std::vector<TestCase*>& test_cases) {
  const std::string kTestsuites = "testsuites";
  const std::string kIndent = Indent(2);
  *stream << "{\n";
  int total_tests = 0;
  for (size_t i = 0; i < test_cases.size(); ++i) {
    total_tests += test_cases[i]->total_test_count();
  }
  OutputJsonKey(stream, kTestsuites, "tests", total_tests, kIndent);

  OutputJsonKey(stream, kTestsuites, "name", "AllTests", kIndent);
  *stream << kIndent << "\"" << kTestsuites << "\": [\n";

  for (size_t i = 0; i < test_cases.size(); ++i) {
    if (i != 0) {
      *stream << ",\n";
    }
    PrintJsonTestCase(stream, *test_cases[i]);
  }

  *stream << "\n"
          << kIndent << "]\n"
          << "}\n";
}